

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O3

void __thiscall
chrono::ChContactContainerSMC::InjectKRMmatrices
          (ChContactContainerSMC *this,ChSystemDescriptor *mdescriptor)

{
  _Node *__tmp;
  _Node *__tmp_9;
  _List_node_base *p_Var1;
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
  local_118;
  _List_node_base local_100;
  _List_node_base local_e8;
  _List_node_base local_d0;
  _List_node_base local_b8;
  _List_node_base local_a0;
  _List_node_base local_88;
  _List_node_base local_70;
  _List_node_base local_58;
  _List_node_base local_40;
  
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
          *)&local_40,&this->contactlist_3_3);
  for (p_Var1 = local_40._M_next; p_Var1 != &local_40;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_40._M_next != &local_40) {
    p_Var1 = (local_40._M_next)->_M_next;
    operator_delete(local_40._M_next,0x18);
    local_40._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
          *)&local_58,&this->contactlist_6_3);
  for (p_Var1 = local_58._M_next; p_Var1 != &local_58;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_58._M_next != &local_58) {
    p_Var1 = (local_58._M_next)->_M_next;
    operator_delete(local_58._M_next,0x18);
    local_58._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
          *)&local_70,&this->contactlist_6_6);
  for (p_Var1 = local_70._M_next; p_Var1 != &local_70;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_70._M_next != &local_70) {
    p_Var1 = (local_70._M_next)->_M_next;
    operator_delete(local_70._M_next,0x18);
    local_70._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
          *)&local_88,&this->contactlist_333_3);
  for (p_Var1 = local_88._M_next; p_Var1 != &local_88;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_88._M_next != &local_88) {
    p_Var1 = (local_88._M_next)->_M_next;
    operator_delete(local_88._M_next,0x18);
    local_88._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
          *)&local_a0,&this->contactlist_333_6);
  for (p_Var1 = local_a0._M_next; p_Var1 != &local_a0;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_a0._M_next != &local_a0) {
    p_Var1 = (local_a0._M_next)->_M_next;
    operator_delete(local_a0._M_next,0x18);
    local_a0._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
          *)&local_b8,&this->contactlist_333_333);
  for (p_Var1 = local_b8._M_next; p_Var1 != &local_b8;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_b8._M_next != &local_b8) {
    p_Var1 = (local_b8._M_next)->_M_next;
    operator_delete(local_b8._M_next,0x18);
    local_b8._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
          *)&local_d0,&this->contactlist_666_3);
  for (p_Var1 = local_d0._M_next; p_Var1 != &local_d0;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_d0._M_next != &local_d0) {
    p_Var1 = (local_d0._M_next)->_M_next;
    operator_delete(local_d0._M_next,0x18);
    local_d0._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
          *)&local_e8,&this->contactlist_666_6);
  for (p_Var1 = local_e8._M_next; p_Var1 != &local_e8;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_e8._M_next != &local_e8) {
    p_Var1 = (local_e8._M_next)->_M_next;
    operator_delete(local_e8._M_next,0x18);
    local_e8._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
          *)&local_100,&this->contactlist_666_333);
  for (p_Var1 = local_100._M_next; p_Var1 != &local_100;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_100._M_next != &local_100) {
    p_Var1 = (local_100._M_next)->_M_next;
    operator_delete(local_100._M_next,0x18);
    local_100._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
  ::list(&local_118,&this->contactlist_666_666);
  p_Var1 = local_118.
           super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (local_118.
      super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_118) {
    do {
      (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)&local_118);
  }
  if (local_118.
      super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_118) {
    do {
      p_Var1 = (local_118.
                super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      operator_delete(local_118.
                      super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
                      ._M_impl._M_node.super__List_node_base._M_next,0x18);
      local_118.
      super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
      ._M_impl._M_node.super__List_node_base._M_next = p_Var1;
    } while (p_Var1 != (_List_node_base *)&local_118);
  }
  return;
}

Assistant:

void ChContactContainerSMC::InjectKRMmatrices(ChSystemDescriptor& mdescriptor) {
    _InjectKRMmatrices(contactlist_3_3, mdescriptor);
    _InjectKRMmatrices(contactlist_6_3, mdescriptor);
    _InjectKRMmatrices(contactlist_6_6, mdescriptor);
    _InjectKRMmatrices(contactlist_333_3, mdescriptor);
    _InjectKRMmatrices(contactlist_333_6, mdescriptor);
    _InjectKRMmatrices(contactlist_333_333, mdescriptor);
    _InjectKRMmatrices(contactlist_666_3, mdescriptor);
    _InjectKRMmatrices(contactlist_666_6, mdescriptor);
    _InjectKRMmatrices(contactlist_666_333, mdescriptor);
    _InjectKRMmatrices(contactlist_666_666, mdescriptor);
}